

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Session.cpp
# Opt level: O3

void __thiscall FIX::Session::next(Session *this,UtcTimeStamp *now)

{
  function<FIX::UtcTimeStamp_()> *pfVar1;
  SessionState *pSVar2;
  int *piVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  byte bVar5;
  long lVar6;
  undefined1 auVar7 [16];
  undefined8 uVar8;
  _Any_data *p_Var9;
  bool bVar10;
  byte bVar11;
  int iVar12;
  int iVar13;
  long *plVar14;
  char *__s;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *unaff_R12;
  undefined1 auVar15 [12];
  string local_68;
  allocator<char> local_41;
  SessionState *local_40;
  _Any_data *local_38;
  
  bVar10 = checkSessionTime(this,now);
  if (!bVar10) {
    reset(this);
    return;
  }
  if (((this->m_state).m_enabled != true) ||
     (bVar10 = TimeRange::isInRange(&this->m_logonTime,now), !bVar10)) {
    if ((this->m_state).m_receivedLogon != true) {
      return;
    }
    if (((this->m_state).m_sentLogon & 1U) == 0) {
      return;
    }
    if ((this->m_state).m_sentLogout == false) {
      unaff_R12 = &local_68.field_2;
      local_68._M_dataplus._M_p = (pointer)unaff_R12;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_68,"Initiated logout request","");
      SessionState::onEvent(&this->m_state,&local_68);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != unaff_R12) {
        operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
      }
      SessionState::logoutReason_abi_cxx11_(&local_68,&this->m_state);
      generateLogout(this,&local_68);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != unaff_R12) {
        operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
      }
    }
  }
  pSVar2 = &this->m_state;
  if ((this->m_state).m_receivedLogon == false) {
    bVar11 = (this->m_state).m_sentLogon;
    bVar5 = (this->m_state).m_initiate;
    if (((~bVar5 | bVar11) & 1) == 0) {
      bVar10 = TimeRange::isInRange(&this->m_logonTime,now);
      if (bVar10) {
        generateLogon(this);
        local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_68,"Initiated logon request","");
        SessionState::onEvent(pSVar2,&local_68);
LAB_001a38bd:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68._M_dataplus._M_p == &local_68.field_2) {
          return;
        }
        operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
        return;
      }
      bVar11 = (this->m_state).m_sentLogon;
      bVar5 = (this->m_state).m_initiate;
    }
    if ((bVar5 & 1) == 0) {
      return;
    }
    if ((bVar11 & 1) == 0) {
      return;
    }
    if ((this->m_timestamper).super__Function_base._M_manager != (_Manager_type)0x0) {
      (*(this->m_timestamper)._M_invoker)
                ((UtcTimeStamp *)&local_68,(_Any_data *)&this->m_timestamper);
      auVar7 = SEXT816(-0x112e0be826d694b3) *
               SEXT816((this->m_state).m_lastReceivedTime.super_DateTime.m_time);
      if (((int)(auVar7._8_8_ >> 0x1a) - (auVar7._12_4_ >> 0x1f)) +
          ((int)(SUB168(SEXT816(0x112e0be826d694b3) *
                        SEXT816((long)local_68.field_2._M_allocated_capacity),8) >> 0x1a) -
          (SUB164(SEXT816(0x112e0be826d694b3) *
                  SEXT816((long)local_68.field_2._M_allocated_capacity),0xc) >> 0x1f)) +
          ((int)local_68._M_string_length - (this->m_state).m_lastReceivedTime.super_DateTime.m_date
          ) * 0x15180 < (this->m_state).m_logonTimeout) {
        return;
      }
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_68,"Timed out waiting for logon response","");
      SessionState::onEvent(pSVar2,&local_68);
LAB_001a39c1:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
      }
      disconnect(this);
      return;
    }
LAB_001a3a1e:
    std::__throw_bad_function_call();
LAB_001a3a23:
    std::__throw_bad_function_call();
  }
  else {
    unaff_R12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)&(this->m_state).m_heartBtInt;
    iVar12 = IntField::getValue((IntField *)unaff_R12);
    if (iVar12 == 0) {
      return;
    }
    if ((this->m_timestamper).super__Function_base._M_manager == (_Manager_type)0x0) {
      std::__throw_bad_function_call();
LAB_001a3a19:
      std::__throw_bad_function_call();
      goto LAB_001a3a1e;
    }
    pfVar1 = &this->m_timestamper;
    (*(this->m_timestamper)._M_invoker)((UtcTimeStamp *)&local_68,(_Any_data *)pfVar1);
    if (((this->m_state).m_sentLogout != false) &&
       (auVar7 = SEXT816(-0x112e0be826d694b3) *
                 SEXT816((this->m_state).m_lastSentTime.super_DateTime.m_time),
       (this->m_state).m_logoutTimeout <=
       ((int)(auVar7._8_8_ >> 0x1a) - (auVar7._12_4_ >> 0x1f)) +
       ((int)(SUB168(SEXT816(0x112e0be826d694b3) *
                     SEXT816((long)local_68.field_2._M_allocated_capacity),8) >> 0x1a) -
       (SUB164(SEXT816(0x112e0be826d694b3) * SEXT816((long)local_68.field_2._M_allocated_capacity),
               0xc) >> 0x1f)) +
       ((int)local_68._M_string_length - (this->m_state).m_lastSentTime.super_DateTime.m_date) *
       0x15180)) {
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_68,"Timed out waiting for logout response","");
      SessionState::onEvent(pSVar2,&local_68);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
      }
      disconnect(this);
    }
    if ((this->m_timestamper).super__Function_base._M_manager == (_Manager_type)0x0)
    goto LAB_001a3a19;
    (*(this->m_timestamper)._M_invoker)((UtcTimeStamp *)&local_68,(_Any_data *)pfVar1);
    bVar10 = SessionState::withinHeartBeat(pSVar2,(UtcTimeStamp *)&local_68);
    if (bVar10) {
      return;
    }
    if ((this->m_timestamper).super__Function_base._M_manager == (_Manager_type)0x0)
    goto LAB_001a3a23;
    local_40 = pSVar2;
    local_38 = (_Any_data *)pfVar1;
    (*(this->m_timestamper)._M_invoker)((UtcTimeStamp *)&local_68,(_Any_data *)pfVar1);
    uVar8 = local_68.field_2._M_allocated_capacity;
    iVar12 = (this->m_state).m_lastReceivedTime.super_DateTime.m_date;
    lVar6 = (this->m_state).m_lastReceivedTime.super_DateTime.m_time;
    iVar13 = IntField::getValue((IntField *)unaff_R12);
    p_Var9 = local_38;
    pSVar2 = local_40;
    auVar7 = SEXT816(lVar6) * SEXT816(-0x112e0be826d694b3);
    if ((double)iVar13 * 2.4 <=
        (double)(((int)(auVar7._8_8_ >> 0x1a) - (auVar7._12_4_ >> 0x1f)) +
                 ((int)(SUB168(SEXT816((long)uVar8) * SEXT816(0x112e0be826d694b3),8) >> 0x1a) -
                 (SUB164(SEXT816((long)uVar8) * SEXT816(0x112e0be826d694b3),0xc) >> 0x1f)) +
                ((int)local_68._M_string_length - iVar12) * 0x15180)) {
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_68,"Timed out waiting for heartbeat","");
      SessionState::onEvent(local_40,&local_68);
      goto LAB_001a39c1;
    }
    if ((this->m_timestamper).super__Function_base._M_manager != (_Manager_type)0x0) {
      (*(this->m_timestamper)._M_invoker)((UtcTimeStamp *)&local_68,local_38);
      bVar10 = SessionState::needTestRequest(pSVar2,(UtcTimeStamp *)&local_68);
      if (bVar10) {
        paVar4 = &local_68.field_2;
        local_68._M_dataplus._M_p = (pointer)paVar4;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"TEST","");
        generateTestRequest(this,&local_68);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68._M_dataplus._M_p != paVar4) {
          operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
        }
        piVar3 = &(this->m_state).m_testRequest;
        *piVar3 = *piVar3 + 1;
        local_68._M_dataplus._M_p = (pointer)paVar4;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_68,"Sent test request TEST","");
        SessionState::onEvent(pSVar2,&local_68);
        goto LAB_001a38bd;
      }
      if ((this->m_timestamper).super__Function_base._M_manager != (_Manager_type)0x0) {
        (*(this->m_timestamper)._M_invoker)((UtcTimeStamp *)&local_68,p_Var9);
        bVar10 = SessionState::needHeartbeat(pSVar2,(UtcTimeStamp *)&local_68);
        if (!bVar10) {
          return;
        }
        generateHeartbeat(this);
        return;
      }
      goto LAB_001a3a2d;
    }
  }
  std::__throw_bad_function_call();
LAB_001a3a2d:
  auVar15 = std::__throw_bad_function_call();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != unaff_R12) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  if (auVar15._8_4_ == 1) {
    plVar14 = (long *)__cxa_begin_catch(auVar15._0_8_);
    __s = (char *)(**(code **)(*plVar14 + 0x10))(plVar14);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,__s,&local_41);
    SessionState::onEvent(&this->m_state,&local_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    disconnect(this);
    __cxa_end_catch();
    return;
  }
  _Unwind_Resume(auVar15._0_8_);
}

Assistant:

void Session::next(const UtcTimeStamp &now) {
  try {
    if (!checkSessionTime(now)) {
      reset();
      return;
    }

    if (!isEnabled() || !isLogonTime(now)) {
      if (isLoggedOn()) {
        if (!m_state.sentLogout()) {
          m_state.onEvent("Initiated logout request");
          generateLogout(m_state.logoutReason());
        }
      } else {
        return;
      }
    }

    if (!m_state.receivedLogon()) {
      if (m_state.shouldSendLogon() && isLogonTime(now)) {
        generateLogon();
        m_state.onEvent("Initiated logon request");
      } else if (m_state.alreadySentLogon() && m_state.logonTimedOut(m_timestamper())) {
        m_state.onEvent("Timed out waiting for logon response");
        disconnect();
      }
      return;
    }

    if (m_state.heartBtInt() == 0) {
      return;
    }

    if (m_state.logoutTimedOut(m_timestamper())) {
      m_state.onEvent("Timed out waiting for logout response");
      disconnect();
    }

    if (m_state.withinHeartBeat(m_timestamper())) {
      return;
    }

    if (m_state.timedOut(m_timestamper())) {
      m_state.onEvent("Timed out waiting for heartbeat");
      disconnect();
    } else {
      if (m_state.needTestRequest(m_timestamper())) {
        generateTestRequest("TEST");
        m_state.testRequest(m_state.testRequest() + 1);
        m_state.onEvent("Sent test request TEST");
      } else if (m_state.needHeartbeat(m_timestamper())) {
        generateHeartbeat();
      }
    }
  } catch (FIX::IOException &e) {
    m_state.onEvent(e.what());
    disconnect();
  }
}